

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O1

void __thiscall
Qentem::
HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
::Sort(HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
       *this,bool ascend)

{
  SizeT *__s;
  SizeT *pSVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  uint uVar3;
  
  if ((int)CONCAT71(in_register_00000031,ascend) == 0) {
    Memory::
    Sort<false,Qentem::HAItem_T<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>,unsigned_int>
              ((HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
               (this->hashTable_ + this->capacity_),0,this->index_);
  }
  else {
    Memory::Sort<true,Qentem::HAItem_T<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>,unsigned_int>
              ((HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
               (this->hashTable_ + this->capacity_),0,this->index_);
  }
  __s = this->hashTable_;
  uVar3 = this->capacity_ * 4;
  uVar2 = 0;
  if (0xf < uVar3) {
    uVar2 = (ulong)(uVar3 & 0xfffffff0);
    pSVar1 = __s + 4;
    if (__s + 4 < (SizeT *)(uVar2 + (long)__s)) {
      pSVar1 = (SizeT *)(uVar2 + (long)__s);
    }
    memset(__s,0,(~(ulong)__s + (long)pSVar1 & 0xfffffffffffffff0) + 0x10);
  }
  if ((uint)uVar2 < uVar3) {
    memset((void *)((long)__s + uVar2),0,(ulong)(uVar3 + ~(uint)uVar2) + 1);
  }
  generateHash(this);
  return;
}

Assistant:

void Sort(const bool ascend = true) noexcept {
        constexpr SizeT32 size = sizeof(SizeT);

        if (ascend) {
            Memory::Sort<true>(Storage(), SizeT{0}, Size());
        } else {
            Memory::Sort<false>(Storage(), SizeT{0}, Size());
        }

        Memory::SetToZero(getHashTable(), (size * Capacity()));
        generateHash();
    }